

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

void GlobOpt::TrackByteCodeSymUsed
               (Instr *instr,BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed,
               PropertySym **pPropertySym)

{
  PropertySym *pPVar1;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *this;
  Opnd *pOVar4;
  StackSym *pSVar5;
  undefined4 *puVar6;
  StackSym *stackSym;
  Opnd *dst;
  PropertySym *propertySymFromSrc;
  Opnd *src;
  PropertySym **pPropertySym_local;
  BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed_local;
  Instr *instr_local;
  
  this = Func::GetJITFunctionBody(instr->m_func);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(this);
  if (!bVar3) {
    pOVar4 = IR::Instr::GetSrc1(instr);
    if (pOVar4 != (Opnd *)0x0) {
      TrackByteCodeSymUsed(pOVar4,instrByteCodeStackSymUsed,pPropertySym);
      pOVar4 = IR::Instr::GetSrc2(instr);
      if (pOVar4 != (Opnd *)0x0) {
        TrackByteCodeSymUsed(pOVar4,instrByteCodeStackSymUsed,pPropertySym);
      }
    }
    pPVar1 = *pPropertySym;
    pOVar4 = IR::Instr::GetDst(instr);
    if ((pOVar4 != (Opnd *)0x0) &&
       (pSVar5 = IR::Opnd::GetStackSym(pOVar4), pSVar5 == (StackSym *)0x0)) {
      TrackByteCodeSymUsed(pOVar4,instrByteCodeStackSymUsed,pPropertySym);
    }
    if ((pPVar1 != (PropertySym *)0x0) && (pPVar1 != *pPropertySym)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x15a,
                         "(propertySymFromSrc == __null || propertySymFromSrc == *pPropertySym)",
                         "Lost a property sym use?");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackByteCodeSymUsed(IR::Instr * instr, BVSparse<JitArenaAllocator> * instrByteCodeStackSymUsed, PropertySym **pPropertySym)
{
    if(instr->m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        return;
    }
    IR::Opnd * src = instr->GetSrc1();
    if (src)
    {
        TrackByteCodeSymUsed(src, instrByteCodeStackSymUsed, pPropertySym);
        src = instr->GetSrc2();
        if (src)
        {
            TrackByteCodeSymUsed(src, instrByteCodeStackSymUsed, pPropertySym);
        }
    }

#if DBG
    // There should be no more than one property sym used.
    PropertySym *propertySymFromSrc = *pPropertySym;
#endif

    IR::Opnd * dst = instr->GetDst();
    if (dst)
    {
        StackSym *stackSym = dst->GetStackSym();

        // We want stackSym uses: IndirOpnd and SymOpnds of propertySyms.
        // RegOpnd and SymOPnd of StackSyms are stack sym defs.
        if (stackSym == NULL)
        {
            TrackByteCodeSymUsed(dst, instrByteCodeStackSymUsed, pPropertySym);
        }
    }

#if DBG
    AssertMsg(propertySymFromSrc == NULL || propertySymFromSrc == *pPropertySym,
              "Lost a property sym use?");
#endif
}